

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall OSTEI_HRR_Algorithm_Base::Create(OSTEI_HRR_Algorithm_Base *this,QAM *am)

{
  initializer_list<QAM> __l;
  OSTEI_HRR_Algorithm_Base *in_RSI;
  allocator_type *in_RDI;
  QAM *in_stack_ffffffffffffff18;
  QAM *in_stack_ffffffffffffff20;
  undefined1 **local_b0;
  less<QAM> *in_stack_ffffffffffffff68;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *in_stack_ffffffffffffff70;
  iterator pQVar1;
  undefined1 *in_stack_ffffffffffffff80;
  undefined1 *local_50;
  undefined8 local_48;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *in_stack_ffffffffffffffe8;
  
  pQVar1 = (iterator)&stack0xffffffffffffff80;
  QAM::QAM(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_50 = &stack0xffffffffffffff80;
  local_48 = 1;
  std::allocator<QAM>::allocator((allocator<QAM> *)0x13521d);
  __l._M_len = (size_type)in_stack_ffffffffffffff80;
  __l._M_array = pQVar1;
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            (in_stack_ffffffffffffff70,__l,in_stack_ffffffffffffff68,in_RDI);
  Create(in_RSI,in_stack_ffffffffffffffe8);
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x135267);
  std::allocator<QAM>::~allocator((allocator<QAM> *)0x135271);
  local_b0 = &local_50;
  do {
    local_b0 = local_b0 + -6;
    QAM::~QAM((QAM *)0x135297);
  } while (local_b0 != (undefined1 **)&stack0xffffffffffffff80);
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(QAM am)
{
    Create(std::set<QAM>{am});
}